

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::estimatePixelValueRange(ConstPixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  TextureChannelClass TVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int z;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Vec4 p;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  TVar5 = getTextureChannelClass((access->m_format).type);
  if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    uVar13 = 0xbf800000bf800000;
    uVar14 = 0xbf800000bf800000;
  }
  else {
    if (TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      minVal->m_data[0] = 3.4028235e+38;
      minVal->m_data[1] = 3.4028235e+38;
      minVal->m_data[2] = 3.4028235e+38;
      minVal->m_data[3] = 3.4028235e+38;
      maxVal->m_data[0] = 1.1754944e-38;
      maxVal->m_data[1] = 1.1754944e-38;
      maxVal->m_data[2] = 1.1754944e-38;
      maxVal->m_data[3] = 1.1754944e-38;
      iVar6 = (access->m_size).m_data[2];
      if (iVar6 < 1) {
        return;
      }
      iVar8 = (access->m_size).m_data[1];
      iVar7 = 0;
      do {
        if (0 < iVar8) {
          iVar6 = (access->m_size).m_data[0];
          z = 0;
          do {
            if (0 < iVar6) {
              iVar8 = 0;
              do {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&local_48,(int)access,iVar8,z);
                uVar9 = -(uint)!NAN(local_48);
                uVar10 = -(uint)!NAN(fStack_44);
                uVar11 = -(uint)!NAN(fStack_40);
                uVar12 = -(uint)!NAN(fStack_3c);
                fVar1 = minVal->m_data[0];
                fVar2 = minVal->m_data[1];
                fVar3 = minVal->m_data[2];
                fVar4 = minVal->m_data[3];
                minVal->m_data[0] =
                     (float)((~-(uint)(fVar1 <= local_48) & (uint)local_48 |
                             (uint)fVar1 & -(uint)(fVar1 <= local_48)) & uVar9 |
                            ~uVar9 & (uint)fVar1);
                minVal->m_data[1] =
                     (float)((~-(uint)(fVar2 <= fStack_44) & (uint)fStack_44 |
                             (uint)fVar2 & -(uint)(fVar2 <= fStack_44)) & uVar10 |
                            ~uVar10 & (uint)fVar2);
                minVal->m_data[2] =
                     (float)((~-(uint)(fVar3 <= fStack_40) & (uint)fStack_40 |
                             (uint)fVar3 & -(uint)(fVar3 <= fStack_40)) & uVar11 |
                            ~uVar11 & (uint)fVar3);
                minVal->m_data[3] =
                     (float)((~-(uint)(fVar4 <= fStack_3c) & (uint)fStack_3c |
                             (uint)fVar4 & -(uint)(fVar4 <= fStack_3c)) & uVar12 |
                            ~uVar12 & (uint)fVar4);
                fVar1 = maxVal->m_data[0];
                fVar2 = maxVal->m_data[1];
                fVar3 = maxVal->m_data[2];
                fVar4 = maxVal->m_data[3];
                maxVal->m_data[0] =
                     (float)(~uVar9 & (uint)fVar1 |
                            (~-(uint)(local_48 <= fVar1) & (uint)local_48 |
                            (uint)fVar1 & -(uint)(local_48 <= fVar1)) & uVar9);
                maxVal->m_data[1] =
                     (float)(~uVar10 & (uint)fVar2 |
                            (~-(uint)(fStack_44 <= fVar2) & (uint)fStack_44 |
                            (uint)fVar2 & -(uint)(fStack_44 <= fVar2)) & uVar10);
                maxVal->m_data[2] =
                     (float)(~uVar11 & (uint)fVar3 |
                            (~-(uint)(fStack_40 <= fVar3) & (uint)fStack_40 |
                            (uint)fVar3 & -(uint)(fStack_40 <= fVar3)) & uVar11);
                maxVal->m_data[3] =
                     (float)(~uVar12 & (uint)fVar4 |
                            (~-(uint)(fStack_3c <= fVar4) & (uint)fStack_3c |
                            (uint)fVar4 & -(uint)(fStack_3c <= fVar4)) & uVar12);
                iVar8 = iVar8 + 2;
                iVar6 = (access->m_size).m_data[0];
              } while (iVar8 < iVar6);
              iVar8 = (access->m_size).m_data[1];
            }
            z = z + 2;
          } while (z < iVar8);
          iVar6 = (access->m_size).m_data[2];
        }
        iVar7 = iVar7 + 2;
      } while (iVar7 < iVar6);
      return;
    }
    uVar13 = 0;
    uVar14 = 0;
  }
  *(undefined8 *)minVal->m_data = uVar13;
  *(undefined8 *)(minVal->m_data + 2) = uVar14;
  maxVal->m_data[0] = 1.0;
  maxVal->m_data[1] = 1.0;
  maxVal->m_data[2] = 1.0;
  maxVal->m_data[3] = 1.0;
  return;
}

Assistant:

void estimatePixelValueRange (const ConstPixelBufferAccess& access, Vec4& minVal, Vec4& maxVal)
{
	const TextureFormat& format = access.getFormat();

	switch (getTextureChannelClass(format.type))
	{
		case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			// Normalized unsigned formats.
			minVal = Vec4(0.0f);
			maxVal = Vec4(1.0f);
			break;

		case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			// Normalized signed formats.
			minVal = Vec4(-1.0f);
			maxVal = Vec4(+1.0f);
			break;

		default:
			// \note Samples every 4/8th pixel.
			minVal = Vec4(std::numeric_limits<float>::max());
			maxVal = Vec4(std::numeric_limits<float>::min());

			for (int z = 0; z < access.getDepth(); z += 2)
			{
				for (int y = 0; y < access.getHeight(); y += 2)
				{
					for (int x = 0; x < access.getWidth(); x += 2)
					{
						Vec4 p = access.getPixel(x, y, z);

						minVal[0] = (deFloatIsNaN(p[0]) ? minVal[0] : de::min(minVal[0], p[0]));
						minVal[1] = (deFloatIsNaN(p[1]) ? minVal[1] : de::min(minVal[1], p[1]));
						minVal[2] = (deFloatIsNaN(p[2]) ? minVal[2] : de::min(minVal[2], p[2]));
						minVal[3] = (deFloatIsNaN(p[3]) ? minVal[3] : de::min(minVal[3], p[3]));

						maxVal[0] = (deFloatIsNaN(p[0]) ? maxVal[0] : de::max(maxVal[0], p[0]));
						maxVal[1] = (deFloatIsNaN(p[1]) ? maxVal[1] : de::max(maxVal[1], p[1]));
						maxVal[2] = (deFloatIsNaN(p[2]) ? maxVal[2] : de::max(maxVal[2], p[2]));
						maxVal[3] = (deFloatIsNaN(p[3]) ? maxVal[3] : de::max(maxVal[3], p[3]));
					}
				}
			}
			break;
	}
}